

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

string * __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::DielectricInterfaceBxDF_const&,pbrt::IdealDiffuseBxDF_const&,float_const&,pbrt::SampledSpectrum_const&,float_const&>
            (__return_storage_ptr__,
             "[ LayeredBxDF top: %s bottom: %s thickness: %f albedo: %s g: %f ]",
             (DielectricInterfaceBxDF *)this,(IdealDiffuseBxDF *)((long)this + 0x1c),
             (float *)((long)this + 0x2c),(SampledSpectrum *)((long)this + 0x34),
             (float *)((long)this + 0x30));
  return __return_storage_ptr__;
}

Assistant:

std::string LayeredBxDF<TopBxDF, BottomBxDF>::ToString() const {
    return StringPrintf(
        "[ LayeredBxDF top: %s bottom: %s thickness: %f albedo: %s g: %f ]", top, bottom,
        thickness, albedo, g);
}